

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::BeginBackref
          (RustSymbolParser *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint in_EAX;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  iVar1 = this->pos_;
  bVar2 = ParseBase62Number(this,(int *)((long)&uStack_18 + 4));
  bVar3 = false;
  if (((bVar2) && (bVar3 = false, -1 < (long)uStack_18)) && (uStack_18._4_4_ < iVar1 + -3)) {
    iVar1 = this->position_depth_;
    if ((long)iVar1 == 0x10) {
      bVar3 = false;
    }
    else {
      this->position_depth_ = iVar1 + 1;
      this->position_stack_[iVar1] = this->pos_;
      this->pos_ = uStack_18._4_4_ + 2;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

ABSL_MUST_USE_RESULT bool BeginBackref() {
    // backref = B base-62-number (B already consumed)
    //
    // Reject backrefs that don't parse, overflow int, or don't point backward.
    // If the offset looks fine, adjust it to account for the _R prefix.
    int offset = 0;
    const int offset_of_this_backref =
        pos_ - 2 /* _R */ - 1 /* B already consumed */;
    if (!ParseBase62Number(offset) || offset < 0 ||
        offset >= offset_of_this_backref) {
      return false;
    }
    offset += 2;

    // Save the old position to restore later.
    if (!PushPosition(pos_)) return false;

    // Move the input position to the backref target.
    //
    // Note that we do not check whether the new position points to the
    // beginning of a construct matching the context in which the backref
    // appeared.  We just jump to it and see whether nested parsing succeeds.
    // We therefore accept various wrong manglings, e.g., a type backref
    // pointing to an 'l' character inside an identifier, which happens to mean
    // i32 when parsed as a type mangling.  This saves the complexity and RAM
    // footprint of remembering which offsets began which kinds of
    // substructures.  Existing demanglers take similar shortcuts.
    pos_ = offset;
    return true;
  }